

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csr.c
# Opt level: O3

int csrMain(int argc,char **argv)

{
  char **names;
  int iVar1;
  bool_t bVar2;
  err_t code;
  int iVar3;
  char *pcVar4;
  octet *privkey;
  err_t eVar5;
  cmd_pwd_t pwd_00;
  long lVar6;
  long lVar7;
  long lVar8;
  octet *csr;
  cmd_pwd_t pwd;
  size_t privkey_len;
  cmd_pwd_t local_60;
  char **local_58;
  size_t local_50;
  size_t local_48;
  long local_40;
  long local_38;
  
  if (argc < 2) {
    printf("bee2cmd/%s: %s\nUsage:\n  csr rewrap -pass <schema> <privkey> <csr> <csr1>\n    rewrap <csr> using <privkey> and store the result in <csr1>\n  csr val <csr>\n    validate <csr>\n  options:\n    -pass <schema> -- password description\n\\warning implemented only with bign-curve256v1\n"
           ,"csr","manage certificate signing requests");
    return -1;
  }
  iVar1 = strCmp(argv[1],"rewrap");
  if (iVar1 == 0) {
    local_60 = (cmd_pwd_t)0x0;
    local_48 = 0;
    code = cmdStDo(8);
    if (code == 0) {
      if (argc == 2) {
        pwd_00 = (cmd_pwd_t)0x0;
        code = 0x25b;
      }
      else {
        local_40 = (ulong)(uint)argc - 2;
        local_38 = (ulong)(uint)argc - 3;
        lVar6 = -0x20;
        lVar8 = -0x10;
        lVar7 = 0;
        local_58 = argv;
        while( true ) {
          argv = local_58;
          bVar2 = strStartsWith(local_58[lVar7 + 2],"-");
          if (bVar2 == 0) {
            pwd_00 = local_60;
            code = 0x25b;
            if ((((argc + -5 == (int)lVar7 && local_60 != (cmd_pwd_t)0x0) &&
                 (code = cmdFileValExist(2,(char **)((long)argv - lVar8)), pwd_00 = local_60,
                 code == 0)) &&
                (code = cmdFileValNotExist(1,(char **)((long)argv - lVar6)), pwd_00 = local_60,
                code == 0)) &&
               (code = cmdPrivkeyRead((octet *)0x0,&local_48,argv[lVar7 + 2],local_60),
               pwd_00 = local_60, code == 0)) {
              code = cmdFileReadAll((void *)0x0,&local_50,argv[lVar7 + 3]);
              if (code != 0) goto LAB_00108b4e;
              privkey = (octet *)blobCreate(local_50 + local_48);
              if (privkey == (octet *)0x0) {
                cmdPwdClose(local_60);
                goto LAB_00108c64;
              }
              csr = privkey + local_48;
              code = cmdPrivkeyRead(privkey,&local_48,argv[lVar7 + 2],local_60);
              cmdPwdClose(local_60);
              if (code == 0) {
                code = cmdFileReadAll(csr,&local_50,local_58[lVar7 + 3]);
                argv = local_58;
                if (code != 0) goto LAB_00108b4e;
                code = bpkiCSRRewrap(csr,local_50,privkey,local_48);
                argv = local_58;
                if (code == 0) {
                  code = cmdFileWrite(local_58[lVar7 + 4],csr,local_50);
                  goto LAB_00108be6;
                }
              }
              blobClose(privkey);
              argv = local_58;
              goto LAB_00108b4e;
            }
            goto LAB_00108b49;
          }
          iVar1 = strCmp(argv[lVar7 + 2],"-pass");
          eVar5 = 0x25b;
          argv = local_58;
          pwd_00 = local_60;
          code = eVar5;
          if (iVar1 != 0) goto LAB_00108b49;
          if (local_60 != (cmd_pwd_t)0x0) break;
          if (((int)local_38 == (int)lVar7) ||
             (code = cmdPwdRead(&local_60,local_58[lVar7 + 3]), argv = local_58, pwd_00 = local_60,
             code != 0)) goto LAB_00108b49;
          lVar7 = lVar7 + 2;
          lVar6 = lVar6 + -0x10;
          lVar8 = lVar8 + -0x10;
          code = eVar5;
          if ((int)local_40 == (int)lVar7) goto LAB_00108b49;
        }
        code = 0x25c;
      }
LAB_00108b49:
      cmdPwdClose(pwd_00);
    }
  }
  else {
    iVar1 = strCmp(argv[1],"val");
    if (iVar1 != 0) {
      code = 0x259;
      iVar1 = -1;
      goto LAB_00108b58;
    }
    code = cmdStDo(8);
    if (code == 0) {
      names = argv + 2;
      code = cmdFileValExist(1,names);
      if ((code == 0) && (code = cmdFileReadAll((void *)0x0,(size_t *)&local_60,*names), code == 0))
      {
        privkey = (octet *)blobCreate((size_t)local_60);
        if (privkey == (octet *)0x0) {
LAB_00108c64:
          code = 0x6e;
        }
        else {
          code = cmdFileReadAll(privkey,(size_t *)&local_60,*names);
          if (code == 0) {
            code = bpkiCSRUnwrap((octet *)0x0,(size_t *)0x0,privkey,(size_t)local_60);
          }
LAB_00108be6:
          blobClose(privkey);
        }
      }
    }
  }
LAB_00108b4e:
  iVar1 = -1;
  if (code == 0) {
    iVar3 = strCmp(argv[1],"val");
    iVar1 = 0;
    code = 0;
    if (iVar3 != 0) {
      return 0;
    }
  }
LAB_00108b58:
  pcVar4 = errMsg(code);
  printf("bee2cmd/%s: %s\n","csr",pcVar4);
  return iVar1;
}

Assistant:

int csrMain(int argc, char* argv[])
{
	err_t code;
	// справка
	if (argc < 2)
		return csrUsage();
	// разбор команды
	++argv, --argc;
	if (strEq(argv[0], "rewrap"))
		code = csrRewrap(argc - 1, argv + 1);
	else if (strEq(argv[0], "val"))
		code = csrVal(argc - 1, argv + 1);
	else
		code = ERR_CMD_NOT_FOUND;
	// завершить
	if (code != ERR_OK || strEq(argv[0], "val"))
		printf("bee2cmd/%s: %s\n", _name, errMsg(code));
	return code != ERR_OK ? -1 : 0;
}